

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

RecyclableObject * Js::JavascriptProxy::AutoProxyWrapper(Var obj)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  PropertyId propertyId;
  ScriptContext *this;
  ThreadContext *this_00;
  ScriptConfiguration *this_01;
  undefined4 *puVar4;
  JavascriptLibrary *pJVar5;
  GlobalObject *instance;
  Arguments local_90;
  CallInfo local_80;
  undefined1 local_78 [8];
  Arguments arguments;
  Var varArgs [3];
  CallInfo local_48;
  CallInfo callInfo;
  Var handler;
  GlobalObject *globalObject;
  PropertyId handlerId;
  ScriptContext *scriptContext;
  RecyclableObject *object;
  Var obj_local;
  
  obj_local = VarTo<Js::RecyclableObject>(obj);
  BVar3 = Js::JavascriptOperators::IsObject((RecyclableObject *)obj_local);
  if ((BVar3 != 0) &&
     (bVar2 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>((RecyclableObject *)obj_local), !bVar2
     )) {
    this = RecyclableObject::GetScriptContext((RecyclableObject *)obj_local);
    this_00 = ScriptContext::GetThreadContext(this);
    bVar2 = ThreadContext::IsScriptActive(this_00);
    if (bVar2) {
      this_01 = ScriptContext::GetConfig(this);
      bVar2 = ScriptConfiguration::IsES6ProxyEnabled(this_01);
      if (bVar2) {
        bVar2 = ConfigFlagsTable::IsEnabled
                          ((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                      ,0x810,
                                      "(Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))"
                                      ,
                                      "Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag)"
                                     );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        propertyId = EnsureHandlerPropertyId(this);
        pJVar5 = ScriptContext::GetLibrary(this);
        instance = JavascriptLibrary::GetGlobalObject(pJVar5);
        callInfo = (CallInfo)0x0;
        BVar3 = Js::JavascriptOperators::GetProperty
                          ((RecyclableObject *)instance,propertyId,(Var *)&callInfo,this,
                           (PropertyValueInfo *)0x0);
        if (BVar3 == 0) {
          pJVar5 = ScriptContext::GetLibrary(this);
          callInfo = (CallInfo)JavascriptLibrary::CreateObject(pJVar5,false,0);
          Js::JavascriptOperators::SetProperty
                    (instance,(RecyclableObject *)instance,propertyId,(Var)callInfo,this,
                     PropertyOperation_None);
        }
        CallInfo::CallInfo(&local_48,CallFlags_Value,3);
        local_80 = local_48;
        Arguments::Arguments((Arguments *)local_78,local_48,&arguments.Values);
        pJVar5 = ScriptContext::GetLibrary(this);
        arguments.Values =
             (Type)JavascriptLibraryBase::GetProxyConstructor(&pJVar5->super_JavascriptLibraryBase);
        Arguments::Arguments(&local_90,(Arguments *)local_78);
        obj_local = Create(this,&local_90);
      }
    }
  }
  return (RecyclableObject *)obj_local;
}

Assistant:

RecyclableObject* JavascriptProxy::AutoProxyWrapper(Var obj)
    {
        RecyclableObject* object = VarTo<RecyclableObject>(obj);
        if (!JavascriptOperators::IsObject(object) || VarIs<JavascriptProxy>(object))
        {
            return object;
        }
        ScriptContext* scriptContext = object->GetScriptContext();
        if (!scriptContext->GetThreadContext()->IsScriptActive())
        {
            return object;
        }
        if (!scriptContext->GetConfig()->IsES6ProxyEnabled())
        {
            return object;
        }
        Assert(Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag));
        PropertyId handlerId = EnsureHandlerPropertyId(scriptContext);
        GlobalObject* globalObject = scriptContext->GetLibrary()->GetGlobalObject();
        Var handler = nullptr;
        if (!JavascriptOperators::GetProperty(globalObject, handlerId, &handler, scriptContext))
        {
            handler = scriptContext->GetLibrary()->CreateObject();
            JavascriptOperators::SetProperty(globalObject, globalObject, handlerId, handler, scriptContext);
        }
        CallInfo callInfo(CallFlags_Value, 3);
        Var varArgs[3];
        Js::Arguments arguments(callInfo, varArgs);
        varArgs[0] = scriptContext->GetLibrary()->GetProxyConstructor();
        varArgs[1] = object;
        varArgs[2] = handler;
        return Create(scriptContext, arguments);
    }